

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_ps_count(stb_ps *ps)

{
  switch((uint)ps & 3) {
  case 0:
    return (int)(ps != (stb_ps *)0x0);
  case 1:
    return ((((uint)(*(long *)(ps + 7) != 0) - (uint)(*(long *)(ps + -1) == 0)) -
            (uint)(*(long *)(ps + 0xf) == 0)) + 3) - (uint)(*(long *)(ps + 0x17) == 0);
  case 2:
    return *(int *)(ps + -2);
  case 3:
    return *(int *)(ps + 5);
  }
}

Assistant:

int stb_ps_count (stb_ps *ps)
{
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps != NULL;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         return (b->p[0] != NULL) + (b->p[1] != NULL) +
                (b->p[2] != NULL) + (b->p[3] != NULL);
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         return a->count;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         return h->count;
      }
   }
   return 0;
}